

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O3

void * metacall_value_cast_buffer(void **v)

{
  type_id tVar1;
  void *pvVar2;
  undefined8 unaff_RBX;
  type_id id;
  value in_stack_00000008;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  pvVar2 = *v;
  if (tVar1 != 8) {
    pvVar2 = value_type_cast(in_stack_00000008,id);
    if (pvVar2 == (value)0x0) {
      pvVar2 = *v;
    }
    else {
      *v = pvVar2;
    }
  }
  pvVar2 = value_to_buffer(pvVar2);
  return pvVar2;
}

Assistant:

void *metacall_value_cast_buffer(void **v)
{
	if (value_type_id(*v) != TYPE_BUFFER)
	{
		value v_cast = value_type_cast(*v, TYPE_BUFFER);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_buffer(*v);
}